

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cc
# Opt level: O3

Status __thiscall
leveldb::DoWriteStringToFile(leveldb *this,Env *env,Slice *data,string *fname,bool should_sync)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  char *extraout_RAX;
  Status SVar3;
  undefined4 extraout_var_00;
  char *extraout_RAX_00;
  WritableFile *file;
  long *local_48;
  char *local_40;
  void *local_38;
  
  iVar2 = (*env->_vptr_Env[4])(this,env,fname,&local_48);
  SVar3.state_ = (char *)CONCAT44(extraout_var,iVar2);
  if (*(long *)this == 0) {
    (**(code **)(*local_48 + 0x10))(&local_40,local_48,data);
    pcVar1 = *(char **)this;
    *(char **)this = local_40;
    SVar3.state_ = local_40;
    local_40 = pcVar1;
    if (pcVar1 != (char *)0x0) {
      operator_delete__(pcVar1);
      SVar3.state_ = *(char **)this;
    }
    if (should_sync && SVar3.state_ == (char *)0x0) {
      (**(code **)(*local_48 + 0x28))(&local_40);
      pcVar1 = *(char **)this;
      *(char **)this = local_40;
      SVar3.state_ = local_40;
      local_40 = pcVar1;
      if (pcVar1 != (char *)0x0) {
        operator_delete__(pcVar1);
        SVar3.state_ = *(char **)this;
      }
    }
    if (SVar3.state_ == (char *)0x0) {
      (**(code **)(*local_48 + 0x18))(&local_40);
      pcVar1 = *(char **)this;
      *(char **)this = local_40;
      SVar3.state_ = local_40;
      local_40 = pcVar1;
      if (pcVar1 != (char *)0x0) {
        operator_delete__(pcVar1);
        SVar3.state_ = extraout_RAX;
      }
    }
    if (local_48 != (long *)0x0) {
      SVar3.state_ = (char *)(**(code **)(*local_48 + 8))();
    }
    if (*(long *)this != 0) {
      iVar2 = (*env->_vptr_Env[8])(&local_38,env,fname);
      SVar3.state_ = (char *)CONCAT44(extraout_var_00,iVar2);
      if (local_38 != (void *)0x0) {
        operator_delete__(local_38);
        SVar3.state_ = extraout_RAX_00;
      }
    }
  }
  return (Status)SVar3.state_;
}

Assistant:

static Status DoWriteStringToFile(Env* env, const Slice& data,
                                  const std::string& fname, bool should_sync) {
  WritableFile* file;
  Status s = env->NewWritableFile(fname, &file);
  if (!s.ok()) {
    return s;
  }
  s = file->Append(data);
  if (s.ok() && should_sync) {
    s = file->Sync();
  }
  if (s.ok()) {
    s = file->Close();
  }
  delete file;  // Will auto-close if we did not close above
  if (!s.ok()) {
    env->RemoveFile(fname);
  }
  return s;
}